

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar1 = (pIVar2->DC).CursorPos.y;
    auVar7._0_4_ = (pIVar2->ClipRect).Max.y - fVar1;
    auVar7._4_4_ = (pIVar2->ClipRect).Min.y - fVar1;
    auVar7._8_4_ = 0.0 - fVar1;
    auVar7._12_4_ = 0.0 - fVar1;
    auVar8._4_4_ = items_height;
    auVar8._0_4_ = items_height;
    auVar8._8_4_ = items_height;
    auVar8._12_4_ = items_height;
    auVar8 = divps(auVar7,auVar8);
    iVar5 = (int)auVar8._0_4_;
    iVar6 = (int)auVar8._4_4_;
    if (GImGui->NavMoveRequest == true) {
      iVar5 = iVar5 - ((int)-(uint)(GImGui->NavMoveClipDir == 3) >> 0x1f);
      iVar6 = iVar6 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar3 = items_count;
    if (iVar6 < items_count) {
      iVar3 = iVar6;
    }
    iVar4 = 0;
    if (-1 < iVar6) {
      iVar4 = iVar3;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 < items_count) {
      items_count = iVar5;
    }
    if (iVar5 < iVar4) {
      items_count = iVar4;
    }
    *out_items_display_start = iVar4;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((window->ClipRect.Min.y - pos.y) / items_height);
    int end = (int)((window->ClipRect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}